

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
image_metrics::compute
          (image_metrics *this,image_u8 *a,image_u8 *b,uint32_t first_channel,uint32_t num_channels)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  double *pdVar6;
  int in_ECX;
  image_u8 *in_RDX;
  image_u8 *in_RSI;
  image_u8 *in_RDI;
  uint in_R8D;
  double dVar7;
  pointer pcVar8;
  double total_values;
  double x_1;
  uint32_t i;
  double sum2;
  double sum;
  uint32_t c;
  color_quad_u8 *cb;
  color_quad_u8 *ca;
  uint32_t x;
  uint32_t y;
  double hist [256];
  uint32_t height;
  uint32_t width;
  bool average_component_error;
  uint in_stack_fffffffffffff758;
  uint32_t in_stack_fffffffffffff75c;
  double local_888;
  uint local_87c;
  double local_878;
  double local_870;
  uint local_864;
  color_quad_u8 *local_860;
  color_quad_u8 *local_858;
  uint local_850;
  uint local_84c;
  double local_848 [257];
  uint32_t local_3c;
  uint32_t local_38;
  uint local_34;
  uint32_t local_30;
  uint32_t local_2c;
  uint local_28;
  undefined1 local_21;
  uint local_20;
  int local_1c;
  image_u8 *local_18;
  image_u8 *local_10;
  
  local_21 = 1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_2c = image_u8::width(in_RSI);
  local_30 = image_u8::width(local_18);
  puVar5 = std::min<unsigned_int>(&local_2c,&local_30);
  local_28 = *puVar5;
  local_38 = image_u8::height(local_10);
  local_3c = image_u8::height(local_18);
  puVar5 = std::min<unsigned_int>(&local_38,&local_3c);
  local_34 = *puVar5;
  memset(local_848,0,0x800);
  for (local_84c = 0; local_84c < local_34; local_84c = local_84c + 1) {
    for (local_850 = 0; local_850 < local_28; local_850 = local_850 + 1) {
      local_858 = image_u8::operator()(in_RDI,in_stack_fffffffffffff75c,in_stack_fffffffffffff758);
      local_860 = image_u8::operator()(in_RDI,in_stack_fffffffffffff75c,in_stack_fffffffffffff758);
      if (local_20 == 0) {
        in_stack_fffffffffffff75c = color_quad_u8::get_luma(local_858);
        iVar2 = color_quad_u8::get_luma(local_860);
        iVar2 = iabs(in_stack_fffffffffffff75c - iVar2);
        local_848[iVar2] = local_848[iVar2] + 1.0;
      }
      else {
        for (local_864 = 0; local_864 < local_20; local_864 = local_864 + 1) {
          bVar1 = color_quad_u8::operator[](local_858,local_1c + local_864);
          in_stack_fffffffffffff758 = (uint)bVar1;
          bVar1 = color_quad_u8::operator[](local_860,local_1c + local_864);
          iVar2 = iabs(in_stack_fffffffffffff758 - bVar1);
          local_848[iVar2] = local_848[iVar2] + 1.0;
        }
      }
    }
  }
  (in_RDI->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_870 = 0.0;
  local_878 = 0.0;
  for (local_87c = 0; local_87c < 0x100; local_87c = local_87c + 1) {
    if ((local_848[local_87c] != 0.0) || (NAN(local_848[local_87c]))) {
      local_888 = (double)local_87c;
      pdVar6 = std::max<double>((double *)in_RDI,&local_888);
      (in_RDI->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*pdVar6;
      dVar7 = (double)local_87c * local_848[local_87c];
      local_870 = local_870 + dVar7;
      local_878 = (double)local_87c * dVar7 + local_878;
    }
  }
  uVar3 = local_28 * local_34;
  uVar4 = clamp<unsigned_int>(local_20,1,4);
  dVar7 = (double)uVar4 * (double)uVar3;
  pcVar8 = (pointer)clamp<double>(local_870 / dVar7,0.0,255.0);
  (in_RDI->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar8;
  pcVar8 = (pointer)clamp<double>(local_878 / dVar7,0.0,65025.0);
  (in_RDI->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcVar8;
  dVar7 = sqrt((double)(in_RDI->m_pixels).
                       super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  *(double *)&in_RDI->m_width = dVar7;
  if ((*(double *)&in_RDI->m_width != 0.0) || (NAN(*(double *)&in_RDI->m_width))) {
    dVar7 = log10(255.0 / *(double *)&in_RDI->m_width);
    pcVar8 = (pointer)clamp<double>(dVar7 * 20.0,0.0,100.0);
    in_RDI[1].m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_start = pcVar8;
  }
  else {
    in_RDI[1].m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x4059000000000000;
  }
  return;
}

Assistant:

void compute(const image_u8 &a, const image_u8 &b, uint32_t first_channel, uint32_t num_channels)
	{
		const bool average_component_error = true;

		const uint32_t width = std::min(a.width(), b.width());
		const uint32_t height = std::min(a.height(), b.height());

		assert((first_channel < 4U) && (first_channel + num_channels <= 4U));

		// Histogram approach originally due to Charles Bloom.
		double hist[256];
		memset(hist, 0, sizeof(hist));

		for (uint32_t y = 0; y < height; y++)
		{
			for (uint32_t x = 0; x < width; x++)
			{
				const color_quad_u8 &ca = a(x, y);
				const color_quad_u8 &cb = b(x, y);

				if (!num_channels)
					hist[iabs(ca.get_luma() - cb.get_luma())]++;
				else
				{
					for (uint32_t c = 0; c < num_channels; c++)
						hist[iabs(ca[first_channel + c] - cb[first_channel + c])]++;
				}
			}
		}

		m_max = 0;
		double sum = 0.0f, sum2 = 0.0f;
		for (uint32_t i = 0; i < 256; i++)
		{
			if (!hist[i])
				continue;

			m_max = std::max<double>(m_max, i);

			double x = i * hist[i];

			sum += x;
			sum2 += i * x;
		}

		// See http://richg42.blogspot.com/2016/09/how-to-compute-psnr-from-old-berkeley.html
		double total_values = width * height;

		if (average_component_error)
			total_values *= clamp<uint32_t>(num_channels, 1, 4);

		m_mean = clamp<double>(sum / total_values, 0.0f, 255.0f);
		m_mean_squared = clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);

		m_root_mean_squared = sqrt(m_mean_squared);

		if (!m_root_mean_squared)
			m_peak_snr = 100.0f;
		else
			m_peak_snr = clamp<double>(log10(255.0f / m_root_mean_squared) * 20.0f, 0.0f, 100.0f);
	}